

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O0

void SimpleVFilter16_SSE2(uint8_t *p,int stride,int thresh)

{
  longlong lVar1;
  longlong lVar2;
  longlong lVar3;
  longlong lVar4;
  __m128i *p0_00;
  longlong *plVar5;
  int in_ESI;
  __m128i *in_RDI;
  __m128i q1;
  __m128i q0;
  __m128i p0;
  __m128i p1;
  
  p0_00 = (__m128i *)((long)*in_RDI + (long)-in_ESI);
  lVar1 = (*p0_00)[0];
  lVar2 = (*p0_00)[1];
  lVar3 = (*in_RDI)[0];
  lVar4 = (*in_RDI)[1];
  DoFilter2_SSE2((__m128i *)((long)*in_RDI + (long)(in_ESI * -2)),p0_00,in_RDI,
                 (__m128i *)((long)*in_RDI + (long)in_ESI),(int)((ulong)in_RDI >> 0x20));
  plVar5 = (longlong *)((long)*in_RDI + (long)-in_ESI);
  *plVar5 = lVar1;
  plVar5[1] = lVar2;
  (*in_RDI)[0] = lVar3;
  (*in_RDI)[1] = lVar4;
  return;
}

Assistant:

static void SimpleVFilter16_SSE2(uint8_t* p, int stride, int thresh) {
  // Load
  __m128i p1 = _mm_loadu_si128((__m128i*)&p[-2 * stride]);
  __m128i p0 = _mm_loadu_si128((__m128i*)&p[-stride]);
  __m128i q0 = _mm_loadu_si128((__m128i*)&p[0]);
  __m128i q1 = _mm_loadu_si128((__m128i*)&p[stride]);

  DoFilter2_SSE2(&p1, &p0, &q0, &q1, thresh);

  // Store
  _mm_storeu_si128((__m128i*)&p[-stride], p0);
  _mm_storeu_si128((__m128i*)&p[0], q0);
}